

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O2

Hop_Obj_t * Hop_ObjCreatePo(Hop_Man_t *p,Hop_Obj_t *pDriver)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Hop_Obj_t *Entry;
  
  Entry = Hop_ManFetchMemory(p);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff8 | 3;
  Vec_PtrPush(p->vPos,Entry);
  Entry->pFanin0 = pDriver;
  uVar1 = *(uint *)(((ulong)pDriver & 0xfffffffffffffffe) + 0x20);
  uVar2 = uVar1 & 0xffffffc0;
  if (p->fRefCount == 0) {
    uVar2 = *(uint *)&Entry->field_0x20 & 0x3f | uVar2;
    *(uint *)&Entry->field_0x20 = uVar2;
  }
  else {
    *(uint *)(((ulong)pDriver & 0xfffffffffffffffe) + 0x20) = uVar2 + (uVar1 & 0x3f) + 0x40;
    uVar2 = *(uint *)&Entry->field_0x20;
  }
  iVar3 = Hop_ObjPhaseCompl(pDriver);
  *(uint *)&Entry->field_0x20 = (uVar2 & 0xfffffff7) + iVar3 * 8;
  p->nObjs[3] = p->nObjs[3] + 1;
  return Entry;
}

Assistant:

Hop_Obj_t * Hop_ObjCreatePo( Hop_Man_t * p, Hop_Obj_t * pDriver )
{
    Hop_Obj_t * pObj;
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = AIG_PO;
    Vec_PtrPush( p->vPos, pObj );
    // add connections
    pObj->pFanin0 = pDriver;
    if ( p->fRefCount )
        Hop_ObjRef( Hop_Regular(pDriver) );
    else
        pObj->nRefs = Hop_ObjLevel( Hop_Regular(pDriver) );
    // set the phase
    pObj->fPhase = Hop_ObjPhaseCompl(pDriver);
    // update node counters of the manager
    p->nObjs[AIG_PO]++;
    return pObj;
}